

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::process_request
          (Server *this,Stream *strm,bool last_connection,bool *connection_close)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  FILE *__stream;
  size_t *__n;
  Stream *__lineptr;
  undefined1 local_b58 [8];
  string boundary;
  string local_b18;
  string *local_af8;
  string *content_type;
  string local_ad0 [32];
  string local_ab0;
  undefined1 local_a90 [8];
  Response res;
  Request req;
  undefined1 local_878 [8];
  stream_line_reader reader;
  char buf [2048];
  int bufsiz;
  bool *connection_close_local;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  __stream = (FILE *)0x800;
  __lineptr = strm;
  detail::stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_878,strm,reader.glowable_buffer_.field_2._M_local_buf + 8,
             0x800);
  uVar2 = detail::stream_line_reader::getline
                    ((stream_line_reader *)local_878,(char **)__lineptr,__n,__stream);
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
    req.progress._M_invoker._0_4_ = 1;
    goto LAB_001cf5a5;
  }
  Request::Request((Request *)&res.streamcb._M_invoker);
  Response::Response((Response *)local_a90);
  std::__cxx11::string::operator=((string *)local_a90,"HTTP/1.1");
  pcVar3 = detail::stream_line_reader::ptr((stream_line_reader *)local_878);
  bVar1 = parse_request_line(this,pcVar3,(Request *)&res.streamcb._M_invoker);
  if ((bVar1) &&
     (bVar1 = detail::read_headers(strm,(Headers *)((long)&req.path.field_2 + 8)), bVar1)) {
    Request::get_header_value_abi_cxx11_
              (&local_ab0,(Request *)&res.streamcb._M_invoker,"Connection",0);
    bVar1 = std::operator==(&local_ab0,"close");
    std::__cxx11::string::~string((string *)&local_ab0);
    if (bVar1) {
      *connection_close = true;
    }
    (*strm->_vptr_Stream[5])(local_ad0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    Request::set_header((Request *)&res.streamcb._M_invoker,"REMOTE_ADDR",pcVar3);
    std::__cxx11::string::~string(local_ad0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&req.version.field_2 + 8),"POST");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&req.version.field_2 + 8),"PUT"), bVar1)) {
      std::function<bool_(unsigned_long,_unsigned_long)>::function
                ((function<bool_(unsigned_long,_unsigned_long)> *)&content_type);
      bVar1 = detail::read_content<httplib::Request>
                        (strm,(Request *)&res.streamcb._M_invoker,
                         (function<bool_(unsigned_long,_unsigned_long)> *)&content_type);
      std::function<bool_(unsigned_long,_unsigned_long)>::~function
                ((function<bool_(unsigned_long,_unsigned_long)> *)&content_type);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        Request::get_header_value_abi_cxx11_
                  (&local_b18,(Request *)&res.streamcb._M_invoker,"Content-Type",0);
        local_af8 = &local_b18;
        Request::get_header_value_abi_cxx11_
                  ((string *)((long)&boundary.field_2 + 8),(Request *)&res.streamcb._M_invoker,
                   "Content-Encoding",0);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&boundary.field_2 + 8),"gzip");
        std::__cxx11::string::~string((string *)(boundary.field_2._M_local_buf + 8));
        if (bVar1) {
          res.version.field_2._8_4_ = 0x19f;
          write_response(this,strm,last_connection,(Request *)&res.streamcb._M_invoker,
                         (Response *)local_a90);
          this_local._7_1_ = 1;
          req.progress._M_invoker._0_4_ = 1;
        }
        else {
          lVar4 = std::__cxx11::string::find((char *)local_af8,0x22c3bc);
          if (lVar4 == 0) {
            detail::parse_query_text
                      ((string *)&req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (Params *)((long)&req.body.field_2 + 8));
          }
          else {
            lVar4 = std::__cxx11::string::find((char *)local_af8,0x22c3de);
            if (lVar4 == 0) {
              std::__cxx11::string::string((string *)local_b58);
              bVar1 = detail::parse_multipart_boundary(local_af8,(string *)local_b58);
              if ((bVar1) &&
                 (bVar1 = detail::parse_multipart_formdata
                                    ((string *)local_b58,
                                     (string *)
                                     &req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                     (MultipartFiles *)
                                     &req.params._M_t._M_impl.super__Rb_tree_header._M_node_count),
                 bVar1)) {
                req.progress._M_invoker._0_4_ = 0;
              }
              else {
                res.version.field_2._8_4_ = 400;
                write_response(this,strm,last_connection,(Request *)&res.streamcb._M_invoker,
                               (Response *)local_a90);
                this_local._7_1_ = 1;
                req.progress._M_invoker._0_4_ = 1;
              }
              std::__cxx11::string::~string((string *)local_b58);
              if ((int)req.progress._M_invoker != 0) goto LAB_001cf4c0;
            }
          }
          req.progress._M_invoker._0_4_ = 0;
        }
LAB_001cf4c0:
        std::__cxx11::string::~string((string *)&local_b18);
        if ((int)req.progress._M_invoker == 0) goto LAB_001cf4ef;
      }
      else {
        res.version.field_2._8_4_ = 400;
        write_response(this,strm,last_connection,(Request *)&res.streamcb._M_invoker,
                       (Response *)local_a90);
        this_local._7_1_ = 1;
        req.progress._M_invoker._0_4_ = 1;
      }
    }
    else {
LAB_001cf4ef:
      bVar1 = routing(this,(Request *)&res.streamcb._M_invoker,(Response *)local_a90);
      if (bVar1) {
        if (res.version.field_2._8_4_ == -1) {
          res.version.field_2._8_4_ = 200;
        }
      }
      else {
        res.version.field_2._8_4_ = 0x194;
      }
      write_response(this,strm,last_connection,(Request *)&res.streamcb._M_invoker,
                     (Response *)local_a90);
      this_local._7_1_ = 1;
      req.progress._M_invoker._0_4_ = 1;
    }
  }
  else {
    res.version.field_2._8_4_ = 400;
    write_response(this,strm,last_connection,(Request *)&res.streamcb._M_invoker,
                   (Response *)local_a90);
    this_local._7_1_ = 1;
    req.progress._M_invoker._0_4_ = 1;
  }
  Response::~Response((Response *)local_a90);
  Request::~Request((Request *)&res.streamcb._M_invoker);
LAB_001cf5a5:
  detail::stream_line_reader::~stream_line_reader((stream_line_reader *)local_878);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::process_request(Stream& strm, bool last_connection, bool& connection_close)
{
    const auto bufsiz = 2048;
    char buf[bufsiz];

    detail::stream_line_reader reader(strm, buf, bufsiz);

    // Connection has been closed on client
    if (!reader.getline()) {
        return false;
    }

    Request req;
    Response res;

    res.version = "HTTP/1.1";

    // Request line and headers
    if (!parse_request_line(reader.ptr(), req) || !detail::read_headers(strm, req.headers)) {
        res.status = 400;
        write_response(strm, last_connection, req, res);
        return true;
    }

    if (req.get_header_value("Connection") == "close") {
        connection_close = true;
    }

    req.set_header("REMOTE_ADDR", strm.get_remote_addr().c_str());

    // Body
    if (req.method == "POST" || req.method == "PUT") {
        if (!detail::read_content(strm, req)) {
            res.status = 400;
            write_response(strm, last_connection, req, res);
            return true;
        }

        const auto& content_type = req.get_header_value("Content-Type");

        if (req.get_header_value("Content-Encoding") == "gzip") {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
            detail::decompress(req.body);
#else
            res.status = 415;
            write_response(strm, last_connection, req, res);
            return true;
#endif
        }

        if (!content_type.find("application/x-www-form-urlencoded")) {
            detail::parse_query_text(req.body, req.params);
        } else if(!content_type.find("multipart/form-data")) {
            std::string boundary;
            if (!detail::parse_multipart_boundary(content_type, boundary) ||
                !detail::parse_multipart_formdata(boundary, req.body, req.files)) {
                res.status = 400;
                write_response(strm, last_connection, req, res);
                return true;
            }
        }
    }

    if (routing(req, res)) {
        if (res.status == -1) {
            res.status = 200;
        }
    } else {
        res.status = 404;
    }

    write_response(strm, last_connection, req, res);
    return true;
}